

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBNO055.cpp
# Opt level: O0

bool __thiscall RTIMUBNO055::IMURead(RTIMUBNO055 *this)

{
  bool bVar1;
  uint64_t uVar2;
  RTVector3 *pRVar3;
  short local_38;
  int16_t z;
  int16_t y;
  int16_t x;
  uchar buffer [24];
  RTIMUBNO055 *this_local;
  
  uVar2 = RTMath::currentUSecsSinceEpoch();
  if (uVar2 - this->m_lastReadTime < (this->super_RTIMU).m_sampleInterval) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = RTMath::currentUSecsSinceEpoch();
    this->m_lastReadTime = uVar2;
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              '\b','\x18',(uchar *)&local_38,"Failed to read BNO055 data");
    if (bVar1) {
      pRVar3 = &(this->super_RTIMU).m_imuData.accel;
      RTVector3::setX(pRVar3,(float)(int)z / 1000.0);
      RTVector3::setY(pRVar3,(float)(int)local_38 / 1000.0);
      RTVector3::setZ(pRVar3,(float)(int)y / 1000.0);
      pRVar3 = &(this->super_RTIMU).m_imuData.compass;
      RTVector3::setX(pRVar3,(float)(int)(short)buffer._0_2_ * -0.0625);
      RTVector3::setY(pRVar3,(float)(int)x * -0.0625);
      RTVector3::setZ(pRVar3,(float)(int)(short)buffer._2_2_ * -0.0625);
      pRVar3 = &(this->super_RTIMU).m_imuData.gyro;
      RTVector3::setX(pRVar3,-(float)(int)(short)buffer._6_2_ / 900.0);
      RTVector3::setY(pRVar3,-(float)(int)(short)buffer._4_2_ / 900.0);
      RTVector3::setZ(pRVar3,-(float)(int)(short)buffer._8_2_ / 900.0);
      pRVar3 = &(this->super_RTIMU).m_imuData.fusionPose;
      RTVector3::setX(pRVar3,(float)(int)(short)buffer._12_2_ / 900.0);
      RTVector3::setY(pRVar3,(float)(int)(short)buffer._14_2_ / 900.0);
      RTVector3::setZ(pRVar3,(float)(int)(short)buffer._10_2_ / 900.0);
      RTQuaternion::fromEuler
                (&(this->super_RTIMU).m_imuData.fusionQPose,
                 &(this->super_RTIMU).m_imuData.fusionPose);
      uVar2 = RTMath::currentUSecsSinceEpoch();
      (this->super_RTIMU).m_imuData.timestamp = uVar2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUBNO055::IMURead()
{
    unsigned char buffer[24];

    if ((RTMath::currentUSecsSinceEpoch() - m_lastReadTime) < m_sampleInterval)
        return false;                                       // too soon

    m_lastReadTime = RTMath::currentUSecsSinceEpoch();
    if (!m_settings->HALRead(m_slaveAddr, BNO055_ACCEL_DATA, 24, buffer, "Failed to read BNO055 data"))
        return false;

    int16_t x, y, z;

    // process accel data

    x = (((uint16_t)buffer[1]) << 8) | ((uint16_t)buffer[0]);
    y = (((uint16_t)buffer[3]) << 8) | ((uint16_t)buffer[2]);
    z = (((uint16_t)buffer[5]) << 8) | ((uint16_t)buffer[4]);

    m_imuData.accel.setX((RTFLOAT)y / 1000.0);
    m_imuData.accel.setY((RTFLOAT)x / 1000.0);
    m_imuData.accel.setZ((RTFLOAT)z / 1000.0);

    // process mag data

    x = (((uint16_t)buffer[7]) << 8) | ((uint16_t)buffer[6]);
    y = (((uint16_t)buffer[9]) << 8) | ((uint16_t)buffer[8]);
    z = (((uint16_t)buffer[11]) << 8) | ((uint16_t)buffer[10]);

    m_imuData.compass.setX(-(RTFLOAT)y / 16.0);
    m_imuData.compass.setY(-(RTFLOAT)x / 16.0);
    m_imuData.compass.setZ(-(RTFLOAT)z / 16.0);

    // process gyro data

    x = (((uint16_t)buffer[13]) << 8) | ((uint16_t)buffer[12]);
    y = (((uint16_t)buffer[15]) << 8) | ((uint16_t)buffer[14]);
    z = (((uint16_t)buffer[17]) << 8) | ((uint16_t)buffer[16]);

    m_imuData.gyro.setX(-(RTFLOAT)y / 900.0);
    m_imuData.gyro.setY(-(RTFLOAT)x / 900.0);
    m_imuData.gyro.setZ(-(RTFLOAT)z / 900.0);

    // process euler angles

    x = (((uint16_t)buffer[19]) << 8) | ((uint16_t)buffer[18]);
    y = (((uint16_t)buffer[21]) << 8) | ((uint16_t)buffer[20]);
    z = (((uint16_t)buffer[23]) << 8) | ((uint16_t)buffer[22]);

    //  put in structure and do axis remap

    m_imuData.fusionPose.setX((RTFLOAT)y / 900.0);
    m_imuData.fusionPose.setY((RTFLOAT)z / 900.0);
    m_imuData.fusionPose.setZ((RTFLOAT)x / 900.0);

    m_imuData.fusionQPose.fromEuler(m_imuData.fusionPose);

    m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    return true;
}